

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void f_parser(lua_State *L,void *ud)

{
  long lVar1;
  byte *pbVar2;
  GCObject *v;
  uint local_44;
  UpVal *up;
  int c;
  SParser *p;
  Closure *cl;
  int i;
  void *ud_local;
  lua_State *L_local;
  
  lVar1 = **ud;
  **ud = lVar1 + -1;
  if (lVar1 == 0) {
    local_44 = luaZ_fill(*ud);
  }
  else {
    pbVar2 = *(byte **)(*ud + 8);
    *(byte **)(*ud + 8) = pbVar2 + 1;
    local_44 = (uint)*pbVar2;
  }
  if (local_44 == 0x1b) {
    checkmode(L,*(char **)((long)ud + 0x50),"binary");
    p = (SParser *)luaU_undump(L,*ud,(Mbuffer *)((long)ud + 8),*(char **)((long)ud + 0x58));
  }
  else {
    checkmode(L,*(char **)((long)ud + 0x50),"text");
    p = (SParser *)
        luaY_parser(L,*ud,(Mbuffer *)((long)ud + 8),(Dyndata *)((long)ud + 0x20),
                    *(char **)((long)ud + 0x58),local_44);
  }
  for (cl._4_4_ = 0; cl._4_4_ < (int)(uint)*(byte *)((long)&(p->buff).buffer + 2);
      cl._4_4_ = cl._4_4_ + 1) {
    v = (GCObject *)luaF_newupval(L);
    (&(p->dyd).actvar.arr)[cl._4_4_] = (Vardesc *)v;
    if ((((v->gch).marked & 3) != 0) && (((ulong)(p->buff).buffer & 0x400) != 0)) {
      luaC_barrier_(L,(GCObject *)p,v);
    }
  }
  return;
}

Assistant:

static void f_parser (lua_State *L, void *ud) {
  int i;
  Closure *cl;
  struct SParser *p = cast(struct SParser *, ud);
  int c = zgetc(p->z);  /* read first character */
  if (c == LUA_SIGNATURE[0]) {
    checkmode(L, p->mode, "binary");
    cl = luaU_undump(L, p->z, &p->buff, p->name);
  }
  else {
    checkmode(L, p->mode, "text");
    cl = luaY_parser(L, p->z, &p->buff, &p->dyd, p->name, c);
  }
  lua_assert(cl->l.nupvalues == cl->l.p->sizeupvalues);
  for (i = 0; i < cl->l.nupvalues; i++) {  /* initialize upvalues */
    UpVal *up = luaF_newupval(L);
    cl->l.upvals[i] = up;
    luaC_objbarrier(L, cl, up);
  }
}